

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O3

void __thiscall avro::json::JsonGenerator::escapeCtl(JsonGenerator *this,char c)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  byte bVar3;
  
  puVar1 = (this->out_).next_;
  if (puVar1 == (this->out_).end_) {
    StreamWriter::more(&this->out_);
    puVar1 = (this->out_).next_;
  }
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = '\\';
  puVar1 = (this->out_).next_;
  if (puVar1 == (this->out_).end_) {
    StreamWriter::more(&this->out_);
    puVar1 = (this->out_).next_;
  }
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = 'U';
  puVar1 = (this->out_).next_;
  if (puVar1 == (this->out_).end_) {
    StreamWriter::more(&this->out_);
    puVar1 = (this->out_).next_;
  }
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = '0';
  puVar1 = (this->out_).next_;
  if (puVar1 == (this->out_).end_) {
    StreamWriter::more(&this->out_);
    puVar1 = (this->out_).next_;
  }
  (this->out_).next_ = puVar1 + 1;
  uVar2 = ((byte)c >> 4) + 0x57;
  if ((byte)c < 0xa0) {
    uVar2 = ((byte)c >> 4) + 0x30;
  }
  *puVar1 = '0';
  puVar1 = (this->out_).next_;
  if (puVar1 == (this->out_).end_) {
    StreamWriter::more(&this->out_);
    puVar1 = (this->out_).next_;
  }
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = uVar2;
  puVar1 = (this->out_).next_;
  if (puVar1 == (this->out_).end_) {
    StreamWriter::more(&this->out_);
    puVar1 = (this->out_).next_;
  }
  bVar3 = c & 0xf;
  uVar2 = bVar3 + 0x57;
  if (bVar3 < 10) {
    uVar2 = bVar3 + 0x30;
  }
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = uVar2;
  return;
}

Assistant:

void escapeCtl(char c) {
        out_.write('\\');
        out_.write('U');
        out_.write('0');
        out_.write('0');
        out_.write(toHex((static_cast<unsigned char>(c)) / 16));
        out_.write(toHex((static_cast<unsigned char>(c)) % 16));
    }